

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_ratio_log_quadrature(REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio)

{
  double dVar1;
  double dVar2;
  double dVar3;
  REF_DBL *pRVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_DBL local_a8 [6];
  REF_DBL aRStack_78 [6];
  REF_DBL aRStack_48 [7];
  
  *ratio = 0.0;
  pRVar4 = ref_node->real;
  iVar5 = node1 * 0xf;
  dVar10 = pRVar4[iVar5];
  dVar8 = pRVar4[(long)iVar5 + 1];
  lVar7 = (long)(node0 * 0xf);
  dVar1 = pRVar4[lVar7];
  dVar2 = pRVar4[lVar7 + 1];
  dVar9 = pRVar4[(long)iVar5 + 2];
  dVar3 = pRVar4[lVar7 + 2];
  lVar7 = 0;
  do {
    aRStack_48[lVar7] = pRVar4[node0 * 0xf + 9 + (int)lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  dVar8 = dVar8 - dVar2;
  lVar7 = 0;
  do {
    aRStack_78[lVar7] = pRVar4[iVar5 + 9 + (int)lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  dVar9 = dVar9 - dVar3;
  lVar7 = 0;
  do {
    local_a8[lVar7] = aRStack_48[lVar7] * 0.5 + aRStack_78[lVar7] * 0.5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  uVar6 = ref_matrix_exp_m(local_a8,&local_d8);
  if (uVar6 == 0) {
    dVar10 = dVar10 - dVar1;
    dVar10 = (local_b0 * dVar9 + dVar10 * local_c8 + dVar8 * local_b8) * dVar9 +
             (local_c8 * dVar9 + local_d8 * dVar10 + dVar8 * local_d0) * dVar10 +
             (local_b8 * dVar9 + local_d0 * dVar10 + local_c0 * dVar8) * dVar8;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    *ratio = dVar10 + *ratio;
    uVar6 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x56c,
           "ref_node_ratio_log_quadrature",(ulong)uVar6,"exp");
  }
  return uVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_node_ratio_log_quadrature(REF_NODE ref_node,
                                                        REF_INT node0,
                                                        REF_INT node1,
                                                        REF_DBL *ratio) {
  REF_DBL mlog0[6], mlog1[6];
  REF_DBL mlog[6], m[6];
  REF_DBL direction[3];
  REF_INT im;
  REF_DBL w0, w1;
  REF_INT i;

  /*
  REF_INT n = 3;
  REF_DBL x[] = {-sqrt(3.0 / 5.0), 0.0, sqrt(3.0 / 5.0)};
  REF_DBL w[] = {5.0 / 9.0, 8.0 / 9.0, 5.0 / 9.0};
  */
  REF_INT n = 1;
  REF_DBL x[] = {0.0};
  REF_DBL w[] = {2.0};

  *ratio = 0.0;

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));
  RSS(ref_node_metric_get_log(ref_node, node0, mlog0), "node0 m");
  RSS(ref_node_metric_get_log(ref_node, node1, mlog1), "node1 m");

  for (i = 0; i < n; i++) {
    w1 = 0.5 * x[i] + 0.5;
    w0 = 1.0 - w1;
    for (im = 0; im < 6; im++) {
      mlog[im] = w0 * mlog0[im] + w1 * mlog1[im];
    }
    RSS(ref_matrix_exp_m(mlog, m), "exp");
    *ratio += 0.5 * w[i] * ref_matrix_sqrt_vt_m_v(m, direction);
  }

  return REF_SUCCESS;
}